

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_info.c
# Opt level: O3

void do_count(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  DESCRIPTOR_DATA *pDVar4;
  char buf [4608];
  char acStack_1228 [4616];
  
  if (descriptor_list == (DESCRIPTOR_DATA *)0x0) {
    iVar3 = 0;
    uVar2 = 0;
  }
  else {
    uVar2 = 0;
    iVar3 = 0;
    pDVar4 = descriptor_list;
    do {
      if (pDVar4->connected == 0) {
        bVar1 = can_see(ch,pDVar4->character);
        if ((!bVar1) || (bVar1 = is_switched(pDVar4->character), bVar1)) {
          iVar3 = iVar3 + 1;
        }
        else {
          uVar2 = uVar2 + 1;
        }
      }
      pDVar4 = pDVar4->next;
    } while (pDVar4 != (DESCRIPTOR_DATA *)0x0);
  }
  if ((int)count_data[0] <= (int)(iVar3 + uVar2)) {
    count_data[0] = (short)(iVar3 + uVar2);
  }
  sprintf(acStack_1228,"There are %d characters on that you can see.\n\r",(ulong)uVar2);
  send_to_char(acStack_1228,ch);
  return;
}

Assistant:

void do_count(CHAR_DATA *ch, char *argument)
{
	auto not_seen = 0;
	auto count = 0;

	for (auto d = descriptor_list; d != nullptr; d = d->next)
	{
		if (d->connected == CON_PLAYING)
		{
			if (can_see(ch, d->character) && !is_switched(d->character))
				count++;
			else
				not_seen++;
		}
	}

	if ((count + not_seen) >= count_data[0])
		count_data[0] = count + not_seen;

	char buf[MAX_STRING_LENGTH];
	sprintf(buf, "There are %d characters on that you can see.\n\r", count);
	send_to_char(buf, ch);
}